

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O0

void __thiscall tonk::gateway::StateMachine::Initialize(StateMachine *this)

{
  Result result;
  uint64_t seed [2];
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffd38;
  LogStringBuffer *in_stack_fffffffffffffd40;
  OutputWorker *in_stack_fffffffffffffd48;
  PCGRandom *in_stack_fffffffffffffd50;
  LogStringBuffer *in_stack_fffffffffffffd78;
  OutputWorker *in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  char *local_70;
  undefined *local_68;
  undefined1 *local_60;
  undefined8 *local_58;
  undefined *local_50;
  undefined1 *local_48;
  undefined8 *local_40;
  undefined *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  PCGRandom *local_18;
  char *local_10;
  undefined1 *local_8;
  
  SecureRandom_Next((uint8_t *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                    (uint)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  if ((in_stack_fffffffffffffd80 != (OutputWorker *)0x0) && (DAT_002b61e8 < 4)) {
    local_78 = &ModuleLogger;
    local_7c = 3;
    local_88 = "SecureRandom failed to generate random seed";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,Trace);
    local_68 = &DAT_002b6218;
    local_58 = &ModuleLogger;
    local_60 = local_210;
    local_70 = local_88;
    in_stack_fffffffffffffd50 = (PCGRandom *)&ModuleLogger;
    local_40 = &ModuleLogger;
    local_50 = local_68;
    local_48 = local_60;
    local_38 = local_68;
    local_30 = local_60;
    std::operator<<(aoStack_200,(string *)&DAT_002b6218);
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    local_18 = in_stack_fffffffffffffd50;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    in_stack_fffffffffffffd48 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1997dc);
  }
  siamese::PCGRandom::Seed
            (in_stack_fffffffffffffd50,(uint64_t)in_stack_fffffffffffffd48,
             (uint64_t)in_stack_fffffffffffffd40);
  Result::~Result((Result *)in_stack_fffffffffffffd40);
  return;
}

Assistant:

void StateMachine::Initialize()
{
    uint64_t seed[2];
    Result result = SecureRandom_Next((uint8_t*)&seed[0], sizeof(seed));
    if (result.IsFail()) {
        ModuleLogger.Warning("SecureRandom failed to generate random seed");
    }
    Rand.Seed(seed[0], seed[1]);
}